

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O2

void __thiscall
ninx::evaluator::DefaultEvaluator::evaluate_function
          (DefaultEvaluator *this,Block *target_object,FunctionDefinition *function,
          unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *body)

{
  Block *pBVar1;
  pointer *__ptr;
  _func_int **local_10;
  
  pBVar1 = (body->_M_t).
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (body->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = (Block *)0x0;
  parser::element::FunctionDefinition::evaluate
            ((FunctionDefinition *)&stack0xfffffffffffffff0,(Block *)function,
             (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)target_object);
  if (pBVar1 != (Block *)0x0) {
    (**(code **)(*(long *)&(pBVar1->super_Expression).super_Statement + 8))();
  }
  if (local_10 != (_func_int **)0x0) {
    (**(code **)(*local_10 + 0x10))(local_10,this);
    if (local_10 != (_func_int **)0x0) {
      (**(code **)(*local_10 + 8))();
    }
  }
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::evaluate_function(ninx::parser::element::Block *target_object,
                                                          ninx::parser::element::FunctionDefinition *function,
                                                          std::unique_ptr<ninx::parser::element::Block> body) {
    // Evaluate the result. ( Used for builtin functions, otherwise it is a noop ).
    auto result {function->evaluate(target_object, std::move(body))};

    if (result) {
        result->accept(this);
    }
}